

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O0

void comp_func_Source_rgbafp_avx2(QRgbaFloat32 *dst,QRgbaFloat32 *src,int length,uint const_alpha)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [24];
  undefined1 auVar11 [24];
  undefined1 (*pauVar12) [24];
  undefined8 *puVar13;
  uint in_ECX;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  float fVar14;
  undefined1 auVar15 [32];
  __m128 dstVector_1;
  __m128 srcVector_1;
  __m256 dstVector;
  __m256 srcVector;
  int x;
  __m256 oneMinusConstAlpha256;
  __m256 constAlphaVector256;
  __m128 oneMinusConstAlpha;
  __m128 constAlphaVector;
  float cia;
  float ca;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined8 uStack_370;
  undefined8 uStack_368;
  int local_324;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  
  if (in_ECX == 0xff) {
    memcpy(in_RDI,in_RSI,(long)in_EDX << 4);
  }
  else {
    fVar14 = (float)in_ECX / 255.0;
    fVar5 = 1.0 - fVar14;
    vpcmpeqd_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
    auVar15 = ZEXT1632(CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(fVar5,fVar5))));
    vpcmpeqd_avx2(auVar15,auVar15);
    auVar1 = vinsertps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar14),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar14),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar14),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar14),0x30);
    auVar3 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar5),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar5),0x30);
    auVar4 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar5),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar5),0x30);
    auVar15._16_16_ = auVar3;
    auVar15._0_16_ = auVar4;
    for (local_324 = 0; local_324 < in_EDX + -1; local_324 = local_324 + 2) {
      vpcmpeqd_avx2(auVar15,auVar15);
      pauVar12 = (undefined1 (*) [24])((long)in_RSI + (long)local_324 * 0x10);
      auVar10 = *pauVar12;
      uVar6 = *(undefined8 *)pauVar12[1];
      pauVar12 = (undefined1 (*) [24])((long)in_RDI + (long)local_324 * 0x10);
      auVar11 = *pauVar12;
      uVar7 = *(undefined8 *)pauVar12[1];
      local_1e0 = auVar10._0_4_;
      fStack_1dc = auVar10._4_4_;
      fStack_1d8 = auVar10._8_4_;
      fStack_1d4 = auVar10._12_4_;
      fStack_1d0 = auVar10._16_4_;
      fStack_1cc = auVar10._20_4_;
      fStack_1c8 = (float)uVar6;
      fStack_1c4 = (float)((ulong)uVar6 >> 0x20);
      local_200 = auVar1._0_4_;
      fStack_1fc = auVar1._4_4_;
      fStack_1f8 = auVar1._8_4_;
      fStack_1f4 = auVar1._12_4_;
      fStack_1f0 = auVar2._0_4_;
      fStack_1ec = auVar2._4_4_;
      fStack_1e8 = auVar2._8_4_;
      local_220 = auVar11._0_4_;
      fStack_21c = auVar11._4_4_;
      fStack_218 = auVar11._8_4_;
      fStack_214 = auVar11._12_4_;
      fStack_210 = auVar11._16_4_;
      fStack_20c = auVar11._20_4_;
      fStack_208 = (float)uVar7;
      fStack_204 = (float)((ulong)uVar7 >> 0x20);
      local_240 = auVar4._0_4_;
      fStack_23c = auVar4._4_4_;
      fStack_238 = auVar4._8_4_;
      fStack_234 = auVar4._12_4_;
      fStack_230 = auVar3._0_4_;
      fStack_22c = auVar3._4_4_;
      fStack_228 = auVar3._8_4_;
      local_380._4_4_ = fStack_21c * fStack_23c + fStack_1dc * fStack_1fc;
      local_380._0_4_ = local_220 * local_240 + local_1e0 * local_200;
      fStack_378 = fStack_218 * fStack_238 + fStack_1d8 * fStack_1f8;
      fStack_374 = fStack_214 * fStack_234 + fStack_1d4 * fStack_1f4;
      uStack_370._0_4_ = fStack_210 * fStack_230 + fStack_1d0 * fStack_1f0;
      uStack_370._4_4_ = fStack_20c * fStack_22c + fStack_1cc * fStack_1ec;
      uStack_368._0_4_ = fStack_208 * fStack_228 + fStack_1c8 * fStack_1e8;
      uStack_368._4_4_ = fStack_204 + fStack_1c4;
      auVar15 = _local_380;
      uStack_368 = auVar15._24_8_;
      auVar15._16_8_ = uStack_370;
      auVar15._0_16_ = _local_380;
      auVar15._24_8_ = uStack_368;
      *(undefined1 (*) [32])((long)in_RDI + (long)local_324 * 0x10) = auVar15;
    }
    if (local_324 < in_EDX) {
      vpcmpeqd_avx(auVar15._0_16_,auVar15._0_16_);
      puVar13 = (undefined8 *)((long)in_RSI + (long)local_324 * 0x10);
      uVar6 = *puVar13;
      uVar7 = puVar13[1];
      puVar13 = (undefined8 *)((long)in_RDI + (long)local_324 * 0x10);
      uVar8 = *puVar13;
      uVar9 = puVar13[1];
      local_110 = (float)uVar6;
      fStack_10c = (float)((ulong)uVar6 >> 0x20);
      fStack_108 = (float)uVar7;
      fStack_104 = (float)((ulong)uVar7 >> 0x20);
      local_130 = (float)uVar8;
      fStack_12c = (float)((ulong)uVar8 >> 0x20);
      fStack_128 = (float)uVar9;
      fStack_124 = (float)((ulong)uVar9 >> 0x20);
      local_3a0 = CONCAT44(fStack_12c * fVar5 + fStack_10c * fVar14,
                           local_130 * fVar5 + local_110 * fVar14);
      uStack_398._0_4_ = fStack_128 * fVar5 + fStack_108 * fVar14;
      uStack_398._4_4_ = fStack_124 * fVar5 + fStack_104 * fVar14;
      puVar13 = (undefined8 *)((long)in_RDI + (long)local_324 * 0x10);
      *puVar13 = local_3a0;
      puVar13[1] = uStack_398;
    }
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_Source_rgbafp_avx2(QRgbaFloat32 *dst, const QRgbaFloat32 *src, int length, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256); // const_alpha is in [0-255]
    if (const_alpha == 255) {
        ::memcpy(dst, src, length * sizeof(QRgbaFloat32));
    } else {
        const float ca = const_alpha / 255.f;
        const float cia = 1.0f - ca;

        const __m128 constAlphaVector = _mm_set1_ps(ca);
        const __m128 oneMinusConstAlpha =  _mm_set1_ps(cia);
        const __m256 constAlphaVector256 = _mm256_set1_ps(ca);
        const __m256 oneMinusConstAlpha256 =  _mm256_set1_ps(cia);
        int x = 0;
        for (; x < length - 1; x += 2) {
            __m256 srcVector = _mm256_loadu_ps((const float *)&src[x]);
            __m256 dstVector = _mm256_loadu_ps((const float *)&dst[x]);
            srcVector = _mm256_mul_ps(srcVector, constAlphaVector256);
            dstVector = _mm256_mul_ps(dstVector, oneMinusConstAlpha256);
            dstVector = _mm256_add_ps(dstVector, srcVector);
            _mm256_storeu_ps((float *)&dst[x], dstVector);
        }
        if (x < length) {
            __m128 srcVector = _mm_loadu_ps((const float *)&src[x]);
            __m128 dstVector = _mm_loadu_ps((const float *)&dst[x]);
            srcVector = _mm_mul_ps(srcVector, constAlphaVector);
            dstVector = _mm_mul_ps(dstVector, oneMinusConstAlpha);
            dstVector = _mm_add_ps(dstVector, srcVector);
            _mm_storeu_ps((float *)&dst[x], dstVector);
        }
    }
}